

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::Address::Set(Error *__return_storage_ptr__,Address *this,string *aIp)

{
  int iVar1;
  char *begin;
  char *pcVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  ByteArray bytes;
  string local_a0;
  undefined1 local_80 [40];
  pointer local_58;
  char *pcStack_50;
  size_t local_48;
  undefined8 local_40;
  format_string_checker<char> *local_38;
  code *local_30;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&bytes,4);
  iVar1 = inet_pton(2,(aIp->_M_dataplus)._M_p,
                    bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  if (iVar1 != 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&bytes,0x10);
    iVar1 = inet_pton(10,(aIp->_M_dataplus)._M_p,
                      bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    if (iVar1 != 1) {
      local_58 = (pointer)CONCAT44(local_58._4_4_,string_type);
      pcStack_50 = "{} is not a valid IP address";
      local_48 = 0x1c;
      local_40._0_4_ = 0;
      local_40._4_4_ = 1;
      local_30 = ::fmt::v10::detail::
                 parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pcVar2 = "{} is not a valid IP address";
      local_38 = (format_string_checker<char> *)&local_58;
      while (begin = pcVar2, begin != "") {
        pcVar2 = begin + 1;
        if (*begin == '}') {
          if ((pcVar2 == "") || (*pcVar2 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar2 = begin + 2;
        }
        else if (*begin == '{') {
          pcVar2 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (begin,"",(format_string_checker<char> *)&local_58);
        }
      }
      local_58 = (aIp->_M_dataplus)._M_p;
      pcStack_50 = (char *)aIp->_M_string_length;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x1c;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&local_58;
      ::fmt::v10::vformat_abi_cxx11_(&local_a0,(v10 *)"{} is not a valid IP address",fmt,args);
      local_80._0_4_ = kInvalidArgs;
      std::__cxx11::string::string((string *)(local_80 + 8),(string *)&local_a0);
      Error::operator=(__return_storage_ptr__,(Error *)local_80);
      std::__cxx11::string::~string((string *)(local_80 + 8));
      std::__cxx11::string::~string((string *)&local_a0);
      goto LAB_0015d950;
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this->mBytes,&bytes);
LAB_0015d950:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

Error Address::Set(const std::string &aIp)
{
    Error     error;
    ByteArray bytes;

    bytes.resize(kIpv4Size);
    if (inet_pton(AF_INET, aIp.c_str(), bytes.data()) != 1)
    {
        bytes.resize(kIpv6Size);
        if (inet_pton(AF_INET6, aIp.c_str(), bytes.data()) != 1)
        {
            ExitNow(error = ERROR_INVALID_ARGS("{} is not a valid IP address", aIp));
        }
    }

    mBytes = bytes;

exit:
    return error;
}